

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task12.cpp
# Opt level: O1

int main(void)

{
  undefined8 in_RAX;
  void *pvVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  int a;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_38 + 4));
  uVar5 = (ulong)uStack_38._4_4_;
  pvVar1 = operator_new__(uVar5);
  if (2 < (long)uVar5) {
    bVar6 = true;
    iVar4 = 2;
    do {
      for (iVar3 = iVar4 * 2; iVar3 < uStack_38._4_4_; iVar3 = iVar3 + iVar4) {
        plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
        std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
        std::ostream::put((char)plVar2);
        std::ostream::flush();
        if (*(char *)((long)pvVar1 + (long)uStack_38._4_4_) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,anon_var_dwarf_8ae,0x13);
          bVar6 = false;
          break;
        }
      }
    } while ((bVar6) && (iVar4 = iVar4 + 1, iVar4 < uStack_38._4_4_));
  }
  operator_delete__(pvVar1);
  return 0;
}

Assistant:

int main(){
    int a;
    bool flag = true;

    cin >> a;

    bool *b = new bool[a];
    for (int i = 2; i < a; i++){
        for (int j = 2*i; j < a; j += i){
            cout << j << endl;
            b[j] == true;
            if (b[a]){
                flag = false;
                cout << "не простое";
                break;
            }
        }
        if (!flag) break;
    }

    delete[] b;
    return 0;
}